

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::AddBreaksAndContinuesToWorklist
          (AggressiveDCEPass *this,Instruction *mergeInst)

{
  uint32_t uVar1;
  Op OVar2;
  IRContext *this_00;
  DefUseManager *pDVar3;
  bool bVar4;
  anon_class_16_2_5349c0aa local_90;
  function<void_(spvtools::opt::Instruction_*)> local_80;
  uint32_t local_5c;
  undefined1 auStack_58 [4];
  uint32_t contId;
  AggressiveDCEPass *local_50;
  function<void_(spvtools::opt::Instruction_*)> local_48;
  uint32_t local_24;
  BasicBlock *pBStack_20;
  uint32_t mergeId;
  BasicBlock *header;
  Instruction *mergeInst_local;
  AggressiveDCEPass *this_local;
  
  header = (BasicBlock *)mergeInst;
  mergeInst_local = (Instruction *)this;
  OVar2 = opt::Instruction::opcode(mergeInst);
  bVar4 = true;
  if (OVar2 != OpSelectionMerge) {
    OVar2 = opt::Instruction::opcode((Instruction *)header);
    bVar4 = OVar2 == OpLoopMerge;
  }
  if (bVar4) {
    this_00 = Pass::context((Pass *)this);
    pBStack_20 = IRContext::get_instr_block(this_00,(Instruction *)header);
    local_24 = opt::Instruction::GetSingleWordInOperand((Instruction *)header,0);
    pDVar3 = Pass::get_def_use_mgr((Pass *)this);
    uVar1 = local_24;
    _auStack_58 = pBStack_20;
    local_50 = this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::AggressiveDCEPass::AddBreaksAndContinuesToWorklist(spvtools::opt::Instruction*)::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_48,
               (anon_class_16_2_49fa660a *)auStack_58);
    analysis::DefUseManager::ForEachUser(pDVar3,uVar1,&local_48);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_48);
    OVar2 = opt::Instruction::opcode((Instruction *)header);
    if (OVar2 == OpLoopMerge) {
      local_5c = opt::Instruction::GetSingleWordInOperand((Instruction *)header,1);
      pDVar3 = Pass::get_def_use_mgr((Pass *)this);
      uVar1 = local_5c;
      local_90.contId = &local_5c;
      local_90.this = this;
      std::function<void(spvtools::opt::Instruction*)>::
      function<spvtools::opt::AggressiveDCEPass::AddBreaksAndContinuesToWorklist(spvtools::opt::Instruction*)::__1,void>
                ((function<void(spvtools::opt::Instruction*)> *)&local_80,&local_90);
      analysis::DefUseManager::ForEachUser(pDVar3,uVar1,&local_80);
      std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_80);
    }
    return;
  }
  __assert_fail("mergeInst->opcode() == spv::Op::OpSelectionMerge || mergeInst->opcode() == spv::Op::OpLoopMerge"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                ,0xda,
                "void spvtools::opt::AggressiveDCEPass::AddBreaksAndContinuesToWorklist(Instruction *)"
               );
}

Assistant:

void AggressiveDCEPass::AddBreaksAndContinuesToWorklist(
    Instruction* mergeInst) {
  assert(mergeInst->opcode() == spv::Op::OpSelectionMerge ||
         mergeInst->opcode() == spv::Op::OpLoopMerge);

  BasicBlock* header = context()->get_instr_block(mergeInst);
  const uint32_t mergeId = mergeInst->GetSingleWordInOperand(0);
  get_def_use_mgr()->ForEachUser(mergeId, [header, this](Instruction* user) {
    if (!user->IsBranch()) return;
    BasicBlock* block = context()->get_instr_block(user);
    if (BlockIsInConstruct(header, block)) {
      // This is a break from the loop.
      AddToWorklist(user);
      // Add branch's merge if there is one.
      Instruction* userMerge = GetMergeInstruction(user);
      if (userMerge != nullptr) AddToWorklist(userMerge);
    }
  });

  if (mergeInst->opcode() != spv::Op::OpLoopMerge) {
    return;
  }

  // For loops we need to find the continues as well.
  const uint32_t contId =
      mergeInst->GetSingleWordInOperand(kLoopMergeContinueBlockIdInIdx);
  get_def_use_mgr()->ForEachUser(contId, [&contId, this](Instruction* user) {
    spv::Op op = user->opcode();
    if (op == spv::Op::OpBranchConditional || op == spv::Op::OpSwitch) {
      // A conditional branch or switch can only be a continue if it does not
      // have a merge instruction or its merge block is not the continue block.
      Instruction* hdrMerge = GetMergeInstruction(user);
      if (hdrMerge != nullptr &&
          hdrMerge->opcode() == spv::Op::OpSelectionMerge) {
        uint32_t hdrMergeId =
            hdrMerge->GetSingleWordInOperand(kSelectionMergeMergeBlockIdInIdx);
        if (hdrMergeId == contId) return;
        // Need to mark merge instruction too
        AddToWorklist(hdrMerge);
      }
    } else if (op == spv::Op::OpBranch) {
      // An unconditional branch can only be a continue if it is not
      // branching to its own merge block.
      BasicBlock* blk = context()->get_instr_block(user);
      Instruction* hdrBranch = GetHeaderBranch(blk);
      if (hdrBranch == nullptr) return;
      Instruction* hdrMerge = GetMergeInstruction(hdrBranch);
      if (hdrMerge->opcode() == spv::Op::OpLoopMerge) return;
      uint32_t hdrMergeId =
          hdrMerge->GetSingleWordInOperand(kSelectionMergeMergeBlockIdInIdx);
      if (contId == hdrMergeId) return;
    } else {
      return;
    }
    AddToWorklist(user);
  });
}